

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall r_comp::Decompiler::write_view(Decompiler *this,uint16_t read_index,uint16_t arity)

{
  ushort local_18;
  bool local_15;
  uint16_t local_14;
  uint16_t local_12;
  uint16_t j;
  bool after_tail_wildcard;
  uint16_t arity_local;
  uint16_t read_index_local;
  Decompiler *this_local;
  
  local_14 = arity;
  local_12 = read_index;
  _j = this;
  if ((arity < 0xe) && (1 < arity)) {
    local_15 = false;
    OutStream::operator<<(this->out_stream,(char (*) [2])"[");
    for (local_18 = 1; local_18 <= local_14; local_18 = local_18 + 1) {
      write_any(this,local_12 + local_18,&local_15,true,0);
      if (local_18 < local_14) {
        OutStream::operator<<(this->out_stream,(char (*) [2])0x1ca3ad);
      }
    }
    OutStream::operator<<(this->out_stream,(char (*) [2])0x1cae09);
  }
  else {
    OutStream::operator<<(this->out_stream,(char (*) [4])"nil");
  }
  return;
}

Assistant:

void Decompiler::write_view(uint16_t read_index, uint16_t arity)
{
    if (arity > VIEW_CODE_MAX_SIZE || arity <= 1) {
        *out_stream << "nil";
        return;
    }

    bool after_tail_wildcard = false;
    *out_stream << "[";

    for (uint16_t j = 1; j <= arity; ++j) {
        write_any(read_index + j, after_tail_wildcard, true);

        if (j < arity) {
            *out_stream << " ";
        }
    }

    *out_stream << "]";
}